

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion.cpp
# Opt level: O2

void __thiscall
iu_DISABLED_TestFailure_x_iutest_x_GE_Test::Body(iu_DISABLED_TestFailure_x_iutest_x_GE_Test *this)

{
  float *in_R9;
  float b;
  float a;
  AssertionResult iutest_ar;
  float local_1f0;
  char local_1ec [4];
  AssertionResult local_1e8;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  local_1ec[0] = -0x33;
  local_1ec[1] = -0x34;
  local_1ec[2] = -0x34;
  local_1ec[3] = '=';
  local_1f0 = 1.0;
  iutest::internal::CmpHelperGE<float,float>
            (&local_1e8,(internal *)0x1fe0df,"b",local_1ec,&local_1f0,in_R9);
  if (local_1e8.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/assertion.cpp"
               ,0x13f,local_1e8.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&local_1e8);
  return;
}

Assistant:

IUTEST(DISABLED_TestFailure, GE)
{
    float a = 0.1f, b = 1.0f;
    IUTEST_ASSERT_GE(a, b);
}